

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::insertItems(Picker *this,int index,QStringList *texts)

{
  int iVar1;
  PickerPrivate *pPVar2;
  QAbstractItemModel *pQVar3;
  Picker *pPVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  QArrayData *this_00;
  P _b;
  P _a;
  ulong uVar9;
  ulong uVar10;
  QList *pQVar11;
  QList<QStandardItem_*> items;
  QModelIndex item;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  Picker *local_80;
  QList *local_78;
  ulong local_70;
  QArrayData *local_68;
  undefined8 uStack_60;
  qsizetype qStack_58;
  QStringList *local_50;
  QModelIndex local_48;
  
  if ((texts->d).size != 0) {
    pPVar2 = (this->d).d;
    pQVar3 = pPVar2->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_a8,&pPVar2->root);
    uVar6 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_a8);
    if ((int)uVar6 < index) {
      index = uVar6;
    }
    local_78 = (QList *)0x0;
    if (0 < index) {
      local_78 = (QList *)(ulong)(uint)index;
    }
    uVar9 = (long)((this->d).d)->maxCount - (long)local_78;
    uVar10 = (texts->d).size;
    if ((long)uVar10 < (long)uVar9) {
      uVar9 = uVar10;
    }
    uVar6 = (uint)uVar9;
    if (0 < (int)uVar6) {
      lVar8 = QMetaObject::cast((QObject *)&QStandardItemModel::staticMetaObject);
      if (lVar8 == 0) {
        pPVar2 = (this->d).d;
        pPVar2->inserting = true;
        pQVar3 = pPVar2->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_a8,&pPVar2->root);
        pQVar11 = local_78;
        cVar5 = (**(code **)(*(long *)pQVar3 + 0xf8))
                          (pQVar3,(ulong)local_78 & 0xffffffff,uVar9 & 0xffffffff,&local_a8);
        if (cVar5 == '\0') {
          ((this->d).d)->inserting = false;
        }
        else {
          local_68 = (QArrayData *)0xffffffffffffffff;
          uStack_60 = 0;
          qStack_58 = 0;
          uVar10 = (ulong)(uVar6 & 0x7fffffff);
          lVar8 = 0;
          local_80 = this;
          local_50 = texts;
          do {
            pPVar4 = local_80;
            pPVar2 = (local_80->d).d;
            pQVar3 = pPVar2->model;
            local_70 = CONCAT44(local_70._4_4_,pPVar2->modelColumn);
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar2->root);
            (**(code **)(*(long *)pQVar3 + 0x60))
                      (&local_a8,pQVar3,(ulong)pQVar11 & 0xffffffff,local_70 & 0xffffffff,&local_48)
            ;
            qStack_58 = local_a8._16_8_;
            local_68 = (QArrayData *)local_a8.shared;
            uStack_60 = local_a8._8_8_;
            pQVar3 = ((pPVar4->d).d)->model;
            QVariant::QVariant((QVariant *)&local_a8,
                               (QString *)((long)&(((local_50->d).ptr)->d).d + lVar8));
            (**(code **)(*(long *)pQVar3 + 0x98))(pQVar3,&local_68,&local_a8,0);
            QVariant::~QVariant((QVariant *)&local_a8);
            this = local_80;
            pQVar11 = (QList *)(ulong)((int)pQVar11 + 1);
            lVar8 = lVar8 + 0x18;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
          pPVar2 = (local_80->d).d;
          pPVar2->inserting = false;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)&local_a8,&pPVar2->root);
          _q_rowsInserted(this,(QModelIndex *)&local_a8,(int)local_78,(int)local_78 + uVar6 + -1);
        }
      }
      else {
        local_a8.shared = (PrivateShared *)0x0;
        local_a8._8_8_ = 0;
        local_a8._16_8_ = 0;
        local_80 = this;
        local_70 = QStandardItemModel::invisibleRootItem();
        uVar10 = (ulong)(uVar6 & 0x7fffffff);
        lVar8 = 0;
        do {
          this_00 = (QArrayData *)operator_new(0x10);
          QStandardItem::QStandardItem
                    ((QStandardItem *)this_00,(QString *)((long)&(((texts->d).ptr)->d).d + lVar8));
          local_68 = this_00;
          QtPrivate::QPodArrayOps<QStandardItem*>::emplace<QStandardItem*&>
                    ((QPodArrayOps<QStandardItem*> *)local_a8.data,local_a8._16_8_,
                     (QStandardItem **)&local_68);
          lVar8 = lVar8 + 0x18;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        QStandardItem::insertRows((int)local_70,local_78);
        this = local_80;
        if ((QArrayData *)local_a8.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_a8.shared = *(int *)local_a8.shared + -1;
          UNLOCK();
          if (*(int *)local_a8.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_a8.shared,8,8);
            this = local_80;
          }
        }
      }
      pPVar2 = (this->d).d;
      pQVar3 = pPVar2->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_a8,&pPVar2->root);
      iVar7 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_a8);
      pPVar2 = (this->d).d;
      iVar1 = pPVar2->maxCount;
      if (iVar7 - iVar1 != 0 && iVar1 <= iVar7) {
        pQVar3 = pPVar2->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&local_a8,&pPVar2->root);
        (**(code **)(*(long *)pQVar3 + 0x108))(pQVar3,iVar1,iVar7 - iVar1,&local_a8);
      }
    }
  }
  return;
}

Assistant:

void
PickerPrivate::initDrawOffsetForFirstUse()
{
	if( !wasPainted && q->count() < itemsCount )
	{
		const int freeItemsCount = ( itemsCount - q->count() );

		const int maxOffset = freeItemsCount * stringHeight +
			( freeItemsCount > 0 ? freeItemsCount - 1 : 0 ) * itemTopMargin;

		drawItemOffset = maxOffset / 2;

		wasPainted = true;
	}
}